

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

aiMatrix4x4 * Assimp::FBX::ReadMatrix(aiMatrix4x4 *__return_storage_ptr__,Element *element)

{
  vector<float,_std::allocator<float>_> values;
  allocator<char> local_49;
  _Vector_base<float,_std::allocator<float>_> local_48;
  string local_28;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (float *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseVectorDataArray((vector<float,_std::allocator<float>_> *)&local_48,element);
  if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start == 0x40) {
    __return_storage_ptr__->a1 = *local_48._M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__->a2 = local_48._M_impl.super__Vector_impl_data._M_start[1];
    __return_storage_ptr__->a3 = local_48._M_impl.super__Vector_impl_data._M_start[2];
    __return_storage_ptr__->a4 = local_48._M_impl.super__Vector_impl_data._M_start[3];
    __return_storage_ptr__->b1 = local_48._M_impl.super__Vector_impl_data._M_start[4];
    __return_storage_ptr__->b2 = local_48._M_impl.super__Vector_impl_data._M_start[5];
    __return_storage_ptr__->b3 = local_48._M_impl.super__Vector_impl_data._M_start[6];
    __return_storage_ptr__->b4 = local_48._M_impl.super__Vector_impl_data._M_start[7];
    __return_storage_ptr__->c1 = local_48._M_impl.super__Vector_impl_data._M_start[8];
    __return_storage_ptr__->c2 = local_48._M_impl.super__Vector_impl_data._M_start[9];
    __return_storage_ptr__->c3 = local_48._M_impl.super__Vector_impl_data._M_start[10];
    __return_storage_ptr__->c4 = local_48._M_impl.super__Vector_impl_data._M_start[0xb];
    __return_storage_ptr__->d1 = local_48._M_impl.super__Vector_impl_data._M_start[0xc];
    __return_storage_ptr__->d2 = local_48._M_impl.super__Vector_impl_data._M_start[0xd];
    __return_storage_ptr__->d3 = local_48._M_impl.super__Vector_impl_data._M_start[0xe];
    __return_storage_ptr__->d4 = local_48._M_impl.super__Vector_impl_data._M_start[0xf];
    aiMatrix4x4t<float>::Transpose(__return_storage_ptr__);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"expected 16 matrix elements",&local_49);
  anon_unknown.dwarf_dd088f::ParseError(&local_28,(Element *)0x0);
}

Assistant:

aiMatrix4x4 ReadMatrix(const Element& element)
{
    std::vector<float> values;
    ParseVectorDataArray(values,element);

    if(values.size() != 16) {
        ParseError("expected 16 matrix elements");
    }

    aiMatrix4x4 result;


    result.a1 = values[0];
    result.a2 = values[1];
    result.a3 = values[2];
    result.a4 = values[3];

    result.b1 = values[4];
    result.b2 = values[5];
    result.b3 = values[6];
    result.b4 = values[7];

    result.c1 = values[8];
    result.c2 = values[9];
    result.c3 = values[10];
    result.c4 = values[11];

    result.d1 = values[12];
    result.d2 = values[13];
    result.d3 = values[14];
    result.d4 = values[15];

    result.Transpose();
    return result;
}